

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDDMAP mtbdd_map_remove(MTBDDMAP map,uint32_t key)

{
  uint8_t *puVar1;
  ulong uVar2;
  MTBDDMAP low;
  MTBDD MVar3;
  long lVar4;
  uint var;
  
  if (map != 0) {
    puVar1 = nodes->data;
    lVar4 = (map & 0xffffffffff) * 0x10;
    uVar2 = *(ulong *)(puVar1 + lVar4 + 8);
    var = (uint)(uVar2 >> 0x28);
    if (var < key) {
      low = mtbdd_map_remove(uVar2 & 0xffffffffff | map & 0x8000000000000000,key);
      MVar3 = mtbdd_makemapnode(var,low,*(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff ^
                                        map & 0x8000000000000000);
      return MVar3;
    }
    if (var <= key) {
      map = map & 0x8000000000000000 | uVar2 & 0xffffffffff;
    }
  }
  return map;
}

Assistant:

MTBDDMAP
mtbdd_map_remove(MTBDDMAP map, uint32_t key)
{
    if (mtbdd_map_isempty(map)) return map;

    mtbddnode_t n = MTBDD_GETNODE(map);
    uint32_t k = mtbddnode_getvariable(n);

    if (k < key) {
        MTBDDMAP low = mtbdd_map_remove(node_getlow(map, n), key);
        return mtbdd_makemapnode(k, low, node_gethigh(map, n));
    } else if (k > key) {
        return map;
    } else {
        return node_getlow(map, n);
    }
}